

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

QByteArray *
QUtf32::convertFromUnicode
          (QByteArray *__return_storage_ptr__,QStringView in,State *state,DataEndianness endian)

{
  QUtf32 *this;
  char *pcVar1;
  char *pcVar2;
  long size;
  DataEndianness in_R9D;
  QStringView in_00;
  __off_t __length;
  
  in_00.m_size = in.m_data;
  pcVar2 = (char *)in.m_size;
  if ((state->internalState & 1) == 0) {
    size = (ulong)((state->flags).super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
                   super_QFlagsStorage<QStringConverterBase::Flag>.i & 4) + (long)pcVar2 * 4;
  }
  else {
    size = (long)pcVar2 * 4;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,size,Uninitialized);
  this = (QUtf32 *)QByteArray::data(__return_storage_ptr__);
  in_00.m_data = (storage_type_conflict *)state;
  pcVar1 = convertFromUnicode(this,pcVar2,in_00,(State *)(ulong)endian,in_R9D);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = &QByteArray::_empty;
  }
  QByteArray::truncate(__return_storage_ptr__,pcVar1 + -(long)pcVar2,__length);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QUtf32::convertFromUnicode(QStringView in, QStringConverter::State *state, DataEndianness endian)
{
    bool writeBom = !(state->internalState & HeaderDone) && state->flags & QStringConverter::Flag::WriteBom;
    qsizetype length =  4*in.size();
    if (writeBom)
        length += 4;
    QByteArray ba(length, Qt::Uninitialized);
    char *end = convertFromUnicode(ba.data(), in, state, endian);
    ba.truncate(end - ba.constData());
    return ba;
}